

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O3

bool duckdb::KeywordHelper::RequiresQuotes(string *text,bool allow_caps)

{
  byte *pbVar1;
  PGKeywordCategory type;
  KeywordCategory KVar2;
  size_type sVar3;
  byte bVar4;
  
  if (text->_M_string_length != 0) {
    pbVar1 = (byte *)(text->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (sVar3 == 0) {
        bVar4 = *pbVar1;
LAB_00e9d85e:
        if (0x19 < (byte)(bVar4 + 0x9f)) {
          if (allow_caps) {
            if ((char)bVar4 < 'A') {
              return true;
            }
            if (bVar4 != 0x5f && 0x5a < bVar4) {
              return true;
            }
          }
          else if (bVar4 != 0x5f) {
            return true;
          }
        }
      }
      else {
        bVar4 = pbVar1[sVar3];
        if (9 < (byte)(bVar4 - 0x30)) goto LAB_00e9d85e;
      }
      sVar3 = sVar3 + 1;
    } while (text->_M_string_length != sVar3);
  }
  type = PostgresParser::IsKeyword(text);
  KVar2 = ToKeywordCategory(type);
  return KVar2 != KEYWORD_NONE;
}

Assistant:

bool KeywordHelper::RequiresQuotes(const string &text, bool allow_caps) {
	for (size_t i = 0; i < text.size(); i++) {
		if (i > 0 && (text[i] >= '0' && text[i] <= '9')) {
			continue;
		}
		if (text[i] >= 'a' && text[i] <= 'z') {
			continue;
		}
		if (allow_caps) {
			if (text[i] >= 'A' && text[i] <= 'Z') {
				continue;
			}
		}
		if (text[i] == '_') {
			continue;
		}
		return true;
	}
	return IsKeyword(text);
}